

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::DAEScanner::create(DAEScanner *this)

{
  unique_ptr<wasm::DAEScanner,_std::default_delete<wasm::DAEScanner>_> local_20 [2];
  DAEScanner *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::DAEScanner,std::unordered_map<wasm::Name,wasm::DAEFunctionInfo,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DAEFunctionInfo>>>*&>
            ((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
              **)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::DAEScanner,std::default_delete<wasm::DAEScanner>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::unique_ptr<wasm::DAEScanner,_std::default_delete<wasm::DAEScanner>_>::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<DAEScanner>(infoMap);
  }